

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_test.cpp
# Opt level: O2

void __thiscall jhu::thrax::TreeTests_Small_Test::TestBody(TreeTests_Small_Test *this)

{
  char *message;
  string_view line;
  AssertHelper local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertionResult gtest_ar;
  Tree t;
  
  line._M_str = "(ROOT (A foo) (B bar))";
  line._M_len = 0x16;
  readTree(&t,line);
  local_40.data_._0_4_ = 3;
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)t.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)t.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
              super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"3","t.size()",(int *)&local_40,(unsigned_long *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/tree_test.cpp"
               ,0x21,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    anon_unknown_10::expectNode
              (0,2,"ROOT",(Node *)0x0,
               *t.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
                super__Vector_impl_data._M_start);
    anon_unknown_10::expectNode
              (0,1,"A",t.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                       _M_impl.super__Vector_impl_data._M_start,
               t.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
               super__Vector_impl_data._M_start[1]);
    anon_unknown_10::expectNode
              (1,2,"B",t.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                       _M_impl.super__Vector_impl_data._M_start,
               t.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
               super__Vector_impl_data._M_start[2]);
  }
  std::_Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::~_Vector_base
            (&t.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>);
  return;
}

Assistant:

TEST(TreeTests, Small) {
  auto t = readTree("(ROOT (A foo) (B bar))");
  ASSERT_EQ(3, t.size());
  expectNode(0, 2, "ROOT", nullptr, t[0]);
  expectNode(0, 1, "A", &t[0], t[1]);
  expectNode(1, 2, "B", &t[0], t[2]);
}